

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O3

ngx_int_t ngx_http_validate_host(ngx_str_t *host,ngx_pool_t *pool,ngx_uint_t alloc)

{
  byte bVar1;
  size_t sVar2;
  u_char *src;
  bool bVar3;
  ngx_int_t nVar4;
  u_char *dst;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t size;
  bool bVar8;
  
  sVar2 = host->len;
  nVar4 = -5;
  if (sVar2 != 0) {
    src = host->data;
    iVar5 = 0;
    sVar7 = 0;
    bVar3 = false;
    sVar6 = sVar2;
    size = sVar2;
    do {
      bVar1 = src[sVar7];
      if (bVar1 < 0x3a) {
        if (bVar1 == 0x2e) {
          bVar8 = sVar7 - 1 == sVar6;
          sVar6 = sVar7;
          if (bVar8) {
            return -5;
          }
        }
        else {
          if (bVar1 == 0) {
            return -5;
          }
          if (bVar1 == 0x2f) {
            return -5;
          }
LAB_0014320f:
          if ((byte)(bVar1 + 0xbf) < 0x1a) {
            bVar3 = true;
          }
        }
      }
      else {
        if (bVar1 == 0x3a) {
          bVar8 = iVar5 == 0;
          if (bVar8) {
            size = sVar7;
          }
        }
        else {
          if (bVar1 == 0x5b) {
            if (sVar7 == 0) {
              iVar5 = 1;
            }
            goto LAB_0014322f;
          }
          if (bVar1 != 0x5d) goto LAB_0014320f;
          bVar8 = iVar5 == 1;
          if (bVar8) {
            size = sVar7 + 1;
          }
        }
        if (bVar8) {
          iVar5 = 2;
        }
      }
LAB_0014322f:
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    if (sVar6 == size - 1) {
      size = size - 1;
    }
    if (size != 0) {
      if (bVar3) {
        dst = (u_char *)ngx_pnalloc(pool,size);
        host->data = dst;
        if (dst == (u_char *)0x0) {
          return -1;
        }
        ngx_strlow(dst,src,size);
      }
      host->len = size;
      nVar4 = 0;
    }
  }
  return nVar4;
}

Assistant:

static ngx_int_t
ngx_http_validate_host(ngx_str_t *host, ngx_pool_t *pool, ngx_uint_t alloc)
{
    u_char  *h, ch;
    size_t   i, dot_pos, host_len;

    enum {
        sw_usual = 0,
        sw_literal,
        sw_rest
    } state;

    dot_pos = host->len;
    host_len = host->len;

    h = host->data;

    state = sw_usual;

    for (i = 0; i < host->len; i++) {
        ch = h[i];

        switch (ch) {

        case '.':
            if (dot_pos == i - 1) {
                return NGX_DECLINED;
            }
            dot_pos = i;
            break;

        case ':':
            if (state == sw_usual) {
                host_len = i;
                state = sw_rest;
            }
            break;

        case '[':
            if (i == 0) {
                state = sw_literal;
            }
            break;

        case ']':
            if (state == sw_literal) {
                host_len = i + 1;
                state = sw_rest;
            }
            break;

        case '\0':
            return NGX_DECLINED;

        default:

            if (ngx_path_separator(ch)) {
                return NGX_DECLINED;
            }

            if (ch >= 'A' && ch <= 'Z') {
                alloc = 1;
            }

            break;
        }
    }

    if (dot_pos == host_len - 1) {
        host_len--;
    }

    if (host_len == 0) {
        return NGX_DECLINED;
    }

    if (alloc) {
        host->data = ngx_pnalloc(pool, host_len);
        if (host->data == NULL) {
            return NGX_ERROR;
        }

        ngx_strlow(host->data, h, host_len);
    }

    host->len = host_len;

    return NGX_OK;
}